

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dump_parameters
          (DG2Dot<dg::LLVMNode> *this,DGParameters<dg::LLVMNode> *params,int ind,bool formal)

{
  ofstream *poVar1;
  LLVMNode *pLVar2;
  LLVMNode *node;
  undefined8 *puVar3;
  _Rb_tree_node_base *p_Var4;
  undefined7 in_register_00000009;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  p_Var4 = *(_Rb_tree_node_base **)(params + 0x48);
  pcVar6 = "IN ARG";
  poVar1 = &this->out;
  bVar7 = (int)CONCAT71(in_register_00000009,formal) != 0;
  if (bVar7) {
    pcVar6 = "[f] IN ARG";
  }
  pcVar5 = "OUT ARG";
  if (bVar7) {
    pcVar5 = "[f] OUT ARG";
  }
  for (; p_Var4 != (_Rb_tree_node_base *)(params + 0x38);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    pLVar2 = (LLVMNode *)p_Var4[1]._M_parent;
    node = (LLVMNode *)p_Var4[1]._M_left;
    if (pLVar2 == (LLVMNode *)0x0) {
      std::operator<<((ostream *)poVar1,"NO IN ARG");
    }
    else {
      dump_node(this,pLVar2,ind,pcVar6);
      dump_node_edges(this,pLVar2,ind);
    }
    if (node == (LLVMNode *)0x0) {
      std::operator<<((ostream *)poVar1,"NO OUT ARG");
    }
    else {
      dump_node(this,node,ind,pcVar5);
      dump_node_edges(this,node,ind);
    }
  }
  p_Var4 = *(_Rb_tree_node_base **)(params + 0x18);
  pcVar6 = "GLOB IN";
  if (formal) {
    pcVar6 = "[f] GLOB IN";
  }
  pcVar5 = "GLOB OUT";
  if (formal) {
    pcVar5 = "[f] GLOB OUT";
  }
  for (; p_Var4 != (_Rb_tree_node_base *)(params + 8);
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if ((LLVMNode *)p_Var4[1]._M_parent == (LLVMNode *)0x0) {
      std::operator<<((ostream *)poVar1,"NO GLOB IN ARG");
    }
    else {
      dump_node(this,(LLVMNode *)p_Var4[1]._M_parent,ind,pcVar6);
      dump_node_edges(this,(LLVMNode *)p_Var4[1]._M_parent,ind);
    }
    if ((LLVMNode *)p_Var4[1]._M_left == (LLVMNode *)0x0) {
      std::operator<<((ostream *)poVar1,"NO GLOB OUT ARG");
    }
    else {
      dump_node(this,(LLVMNode *)p_Var4[1]._M_left,ind,pcVar5);
      dump_node_edges(this,(LLVMNode *)p_Var4[1]._M_left,ind);
    }
  }
  puVar3 = *(undefined8 **)(params + 0x60);
  if (puVar3 != (undefined8 *)0x0) {
    if ((LLVMNode *)*puVar3 == (LLVMNode *)0x0) {
      std::operator<<((ostream *)poVar1,"NO IN va ARG");
    }
    else {
      dump_node(this,(LLVMNode *)*puVar3,ind,"[va] IN ARG");
      dump_node_edges(this,(LLVMNode *)*puVar3,ind);
    }
    if ((LLVMNode *)puVar3[1] == (LLVMNode *)0x0) {
      std::operator<<((ostream *)poVar1,"NO OUT ARG");
    }
    else {
      dump_node(this,(LLVMNode *)puVar3[1],ind,"[va] OUT ARG");
      dump_node_edges(this,(LLVMNode *)puVar3[1],ind);
    }
  }
  pLVar2 = *(LLVMNode **)(params + 0x68);
  if (pLVar2 == (LLVMNode *)0x0) {
    return;
  }
  dump_node(this,pLVar2,ind,"[noret]");
  dump_node_edges(this,pLVar2,ind);
  return;
}

Assistant:

void dump_parameters(DGParameters<NodeT> *params, int ind, bool formal) {
        Indent Ind(ind);

        // FIXME
        // out << Ind << "/* Input parameters */\n";
        // dumpBB(params->getBBIn(), data);
        // out << Ind << "/* Output parameters */\n";
        // dumpBB(params->getBBOut(), data);

        // dump all the nodes again to get the names
        for (auto it : *params) {
            auto &p = it.second;
            if (p.in) {
                dump_node(p.in, ind, formal ? "[f] IN ARG" : "IN ARG");
                dump_node_edges(p.in, ind);
            } else
                out << "NO IN ARG";

            if (p.out) {
                dump_node(p.out, ind, formal ? "[f] OUT ARG" : "OUT ARG");
                dump_node_edges(p.out, ind);
            } else
                out << "NO OUT ARG";
        }

        for (auto I = params->global_begin(), E = params->global_end(); I != E;
             ++I) {
            auto &p = I->second;
            if (p.in) {
                dump_node(p.in, ind, formal ? "[f] GLOB IN" : "GLOB IN");
                dump_node_edges(p.in, ind);
            } else
                out << "NO GLOB IN ARG";

            if (p.out) {
                dump_node(p.out, ind, formal ? "[f] GLOB OUT" : "GLOB OUT");
                dump_node_edges(p.out, ind);
            } else
                out << "NO GLOB OUT ARG";
        }

        auto p = params->getVarArg();
        if (p) {
            if (p->in) {
                dump_node(p->in, ind, "[va] IN ARG");
                dump_node_edges(p->in, ind);
            } else
                out << "NO IN va ARG";

            if (p->out) {
                dump_node(p->out, ind, "[va] OUT ARG");
                dump_node_edges(p->out, ind);
            } else
                out << "NO OUT ARG";
        }

        if (auto *noret = params->getNoReturn()) {
            dump_node(noret, ind, "[noret]");
            dump_node_edges(noret, ind);
        }
    }